

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
::uninitialized_move_n
          (btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::map_params<long,_long,_std::less<long>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_long,_long>_>,_256,_false>_>
          *x,allocator_type *alloc)

{
  undefined8 uVar1;
  long lVar2;
  
  if ((((ulong)x & 7) == 0) && (((ulong)this & 7) == 0)) {
    if (n != 0) {
      lVar2 = 0;
      do {
        uVar1 = *(undefined8 *)(this + lVar2 + i * 0x10 + 0x10 + 8);
        *(undefined8 *)(x + lVar2 + j * 0x10 + 0x10) =
             *(undefined8 *)(this + lVar2 + i * 0x10 + 0x10);
        *(undefined8 *)(x + lVar2 + j * 0x10 + 0x10 + 8) = uVar1;
        lVar2 = lVar2 + 0x10;
      } while (n * 0x10 != lVar2);
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, std::less<long>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }